

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtSourceHolder.h
# Opt level: O1

hash_t __thiscall
Js::
JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
::GetHashCode(JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
              *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  utf8char_t *puVar4;
  size_t sVar5;
  undefined4 *puVar6;
  ulong uVar7;
  
  EnsureSource(this,Source,L"Hash Code Calculation");
  puVar4 = GetMappedSource(this);
  EnsureSource(this,Length,L"Hash Code Calculation");
  sVar5 = GetMappedSourceLength(this);
  if (0xfffffffe < sVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.h"
                                ,0x79,"(byteLength < ((uint32_t)~((uint32_t)0)))",
                                "byteLength < MAXUINT32");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  if ((int)sVar5 == 0) {
    uVar3 = 0x811c9dc5;
  }
  else {
    uVar3 = 0x811c9dc5;
    uVar7 = 0;
    do {
      uVar3 = (puVar4[uVar7] ^ uVar3) * 0x1000193;
      uVar7 = uVar7 + 1;
    } while ((sVar5 & 0xffffffff) != uVar7);
  }
  return uVar3;
}

Assistant:

virtual hash_t GetHashCode() override
        {
            LPCUTF8 source = GetSource(_u("Hash Code Calculation"));
            size_t byteLength = GetByteLength(_u("Hash Code Calculation"));
            Assert(byteLength < MAXUINT32);
            return JsUtil::CharacterBuffer<utf8char_t>::StaticGetHashCode(source, (charcount_t)byteLength);
        }